

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

bool CheckTxScriptsSanity(CMutableTransaction *tx)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  size_type sVar5;
  long in_FS_OFFSET;
  uint i_1;
  uint i;
  CTransaction *in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar6;
  uint in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  bool local_89;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar2 = CTransaction::IsCoinBase
                    ((CTransaction *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  CTransaction::~CTransaction(in_stack_ffffffffffffff18);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    for (in_stack_ffffffffffffff58 = 0; uVar4 = (ulong)in_stack_ffffffffffffff58,
        sVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size(&in_stack_ffffffffffffff18->vin),
        uVar4 < sVar5; in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + 1) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20);
      bVar2 = CScript::HasValidOps
                        ((CScript *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if (!bVar2) {
LAB_001a99c3:
        local_89 = false;
        goto LAB_001a9a99;
      }
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20);
      sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      if (10000 < sVar3) goto LAB_001a99c3;
    }
  }
  uVar6 = 0;
  do {
    uVar4 = (ulong)uVar6;
    sVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff18);
    if (sVar5 <= uVar4) {
      local_89 = true;
LAB_001a9a99:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_89;
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    bVar2 = CScript::HasValidOps
                      ((CScript *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar2) {
LAB_001a9a7b:
      local_89 = false;
      goto LAB_001a9a99;
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20);
    sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    if (10000 < sVar3) goto LAB_001a9a7b;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static bool CheckTxScriptsSanity(const CMutableTransaction& tx)
{
    // Check input scripts for non-coinbase txs
    if (!CTransaction(tx).IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!tx.vin[i].scriptSig.HasValidOps() || tx.vin[i].scriptSig.size() > MAX_SCRIPT_SIZE) {
                return false;
            }
        }
    }
    // Check output scripts
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        if (!tx.vout[i].scriptPubKey.HasValidOps() || tx.vout[i].scriptPubKey.size() > MAX_SCRIPT_SIZE) {
            return false;
        }
    }

    return true;
}